

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

vector<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
* __thiscall
obx::Query<objectbox::tsdemo::SensorValues>::findUniquePtrs
          (vector<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
           *__return_storage_ptr__,Query<objectbox::tsdemo::SensorValues> *this)

{
  undefined1 local_30 [8];
  CollectingVisitorUniquePtr<objectbox::tsdemo::SensorValues> visitor;
  Query<objectbox::tsdemo::SensorValues> *this_local;
  
  visitor.items.
  super__Vector_base<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  if ((this->super_QueryBase).cQuery_ != (OBX_query *)0x0) {
    anon_unknown_3::CollectingVisitorUniquePtr<objectbox::tsdemo::SensorValues>::
    CollectingVisitorUniquePtr
              ((CollectingVisitorUniquePtr<objectbox::tsdemo::SensorValues> *)local_30);
    obx_query_visit((this->super_QueryBase).cQuery_,
                    anon_unknown_3::CollectingVisitorUniquePtr<objectbox::tsdemo::SensorValues>::
                    visit,(CollectingVisitorUniquePtr<objectbox::tsdemo::SensorValues> *)local_30);
    std::
    vector<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
    ::vector(__return_storage_ptr__,
             (vector<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
              *)local_30);
    anon_unknown_3::CollectingVisitorUniquePtr<objectbox::tsdemo::SensorValues>::
    ~CollectingVisitorUniquePtr
              ((CollectingVisitorUniquePtr<objectbox::tsdemo::SensorValues> *)local_30);
    return __return_storage_ptr__;
  }
  internal::throwIllegalStateException("State condition failed: ","cQuery_");
}

Assistant:

std::vector<std::unique_ptr<EntityT>> findUniquePtrs() {
        OBX_VERIFY_STATE(cQuery_);

        CollectingVisitorUniquePtr<EntityT> visitor;
        obx_query_visit(cQuery_, CollectingVisitorUniquePtr<EntityT>::visit, &visitor);
        return std::move(visitor.items);
    }